

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O1

void google::protobuf::json_internal::anon_unknown_4::
     WriteEnum<google::protobuf::json_internal::UnparseProto2Descriptor>
               (JsonWriter *writer,
               Field<google::protobuf::json_internal::UnparseProto2Descriptor> field,int32_t value,
               IntegerEnumStyle int_style)

{
  MessageType MVar1;
  IntegerEnumStyle number;
  string_view name_00;
  string_view sVar2;
  StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  anon_union_8_1_1246618d_for_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_1
  local_50;
  int32_t local_48;
  undefined4 uStack_44;
  char *local_40;
  
  number = int_style;
  sVar2 = Proto2Descriptor::FieldTypeName(field);
  name_00._M_str = sVar2._M_str;
  name_00._M_len = (size_t)name_00._M_str;
  MVar1 = ClassifyMessage((json_internal *)sVar2._M_len,name_00);
  if (MVar1 == kNull) {
    io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"null",4);
    return;
  }
  if ((writer->options_).always_print_enums_as_ints == false) {
    Proto2Descriptor::EnumNameByNumber_abi_cxx11_
              ((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_50.status_,(Proto2Descriptor *)field,(Field)(ulong)(uint)value,number);
    if (local_50 ==
        (anon_union_8_1_1246618d_for_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_1
         )0x1) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,CONCAT44(uStack_44,local_48),
                 (long)local_40 + CONCAT44(uStack_44,local_48));
      JsonWriter::Write<char_const*,std::__cxx11::string,char_const*>(writer,"\"",&local_70,"\"");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      absl::lts_20240722::internal_statusor::
      StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~StatusOrData((StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_50.status_);
      return;
    }
    absl::lts_20240722::internal_statusor::
    StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~StatusOrData((StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50.status_);
  }
  if (int_style == kQuoted) {
    local_50 = (anon_union_8_1_1246618d_for_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_1
                )((long)
                  "Note that enum values use C++ scoping rules, meaning that enum values are siblings of their type, not children of it.  Therefore, \""
                 + 0x82);
    local_40 = "\"";
    local_48 = value;
    EachInner<std::tuple<char_const*,int,char_const*>,google::protobuf::json_internal::JsonWriter::Write<char_const*,int,char_const*>(char_const*,int,char_const*)::_lambda(auto:1)_1_,0ul,1ul,2ul>
              (&local_50,writer);
  }
  else {
    JsonWriter::Write(writer,value);
  }
  return;
}

Assistant:

void WriteEnum(JsonWriter& writer, Field<Traits> field, int32_t value,
               IntegerEnumStyle int_style = IntegerEnumStyle::kUnquoted) {
  if (ClassifyMessage(Traits::FieldTypeName(field)) == MessageType::kNull) {
    writer.Write("null");
    return;
  }

  if (!writer.options().always_print_enums_as_ints) {
    auto name = Traits::EnumNameByNumber(field, value);
    if (name.ok()) {
      writer.Write("\"", *name, "\"");
      return;
    }
  }

  if (int_style == IntegerEnumStyle::kQuoted) {
    writer.Write("\"", value, "\"");
  } else {
    writer.Write(value);
  }
}